

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t icu_63::CollationDataBuilder::encodeOneCEAsCE32(int64_t ce)

{
  uint uVar1;
  
  uVar1 = (uint)((ulong)ce >> 0x20);
  if ((ce & 0xffff00ff00ffU) == 0) {
    return (uint)(byte)((ulong)ce >> 8) | (uint)((ulong)ce >> 0x10) & 0xffff | uVar1;
  }
  if ((ce & 0xffffffffffU) == 0x5000500) {
    return uVar1 | 0xc1;
  }
  uVar1 = (uint)ce | 0xc2;
  if ((char)ce != '\0') {
    uVar1 = 1;
  }
  if ((ulong)ce >> 0x20 != 0) {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

uint32_t
CollationDataBuilder::encodeOneCEAsCE32(int64_t ce) {
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t t = (uint32_t)(ce & 0xffff);
    U_ASSERT((t & 0xc000) != 0xc000);  // Impossible case bits 11 mark special CE32s.
    if((ce & INT64_C(0xffff00ff00ff)) == 0) {
        // normal form ppppsstt
        return p | (lower32 >> 16) | (t >> 8);
    } else if((ce & INT64_C(0xffffffffff)) == Collation::COMMON_SEC_AND_TER_CE) {
        // long-primary form ppppppC1
        return Collation::makeLongPrimaryCE32(p);
    } else if(p == 0 && (t & 0xff) == 0) {
        // long-secondary form ssssttC2
        return Collation::makeLongSecondaryCE32(lower32);
    }
    return Collation::NO_CE32;
}